

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::clearZeroHessian(Highs *this)

{
  HighsInt HVar1;
  HighsHessian *this_00;
  long in_RDI;
  HighsHessian *hessian;
  
  this_00 = (HighsHessian *)(in_RDI + 0x4d0);
  if ((this_00->dim_ != 0) && (HVar1 = HighsHessian::numNz((HighsHessian *)0x4e3267), HVar1 == 0)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                 "Hessian has dimension %d but no nonzeros, so is ignored\n",
                 (ulong)(uint)this_00->dim_);
    HighsHessian::clear(this_00);
  }
  return;
}

Assistant:

void Highs::clearZeroHessian() {
  HighsHessian& hessian = model_.hessian_;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
}